

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# velocypack-common.h
# Opt level: O0

ValueLength arangodb::velocypack::getVariableValueLength(ValueLength value)

{
  ValueLength len;
  ValueLength value_local;
  
  len = 1;
  for (value_local = value; 0x7f < value_local; value_local = value_local >> 7) {
    len = len + 1;
  }
  return len;
}

Assistant:

static inline ValueLength getVariableValueLength(ValueLength value) noexcept {
  ValueLength len = 1;
  while (value >= 0x80U) {
    value >>= 7;
    ++len;
  }
  return len;
}